

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter.c
# Opt level: O2

void filter8(int8_t mask,uint8_t thresh,int8_t flat,uint8_t *op3,uint8_t *op2,uint8_t *op1,
            uint8_t *op0,uint8_t *oq0,uint8_t *oq1,uint8_t *oq2,uint8_t *oq3)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  
  if (mask != '\0' && flat != '\0') {
    bVar1 = *op3;
    uVar8 = (uint)*op2;
    bVar2 = *op1;
    uVar6 = (uint)*op0;
    uVar9 = (uint)*oq0;
    bVar3 = *oq1;
    bVar4 = *oq2;
    bVar5 = *oq3;
    *op2 = (uint8_t)((uint)bVar1 + (uint)bVar1 * 2 + (uint)*op0 + 4 + uVar8 * 2 + (uint)bVar2 +
                     uVar9 >> 3);
    iVar7 = uVar6 + uVar8 + 4;
    *op1 = (uint8_t)(iVar7 + ((uint)bVar2 + (uint)bVar1) * 2 + uVar9 + (uint)bVar3 >> 3);
    *op0 = (uint8_t)(bVar1 + uVar8 + (uint)bVar2 + uVar9 + uVar6 * 2 + (uint)bVar3 + (uint)bVar4 + 4
                    >> 3);
    *oq0 = (uint8_t)((uint)bVar3 + (uint)bVar4 + (uint)bVar5 + iVar7 + (uint)bVar2 + uVar9 * 2 >> 3)
    ;
    iVar7 = uVar6 + uVar9 + 4;
    *oq1 = (uint8_t)((uint)bVar2 + iVar7 + (uint)bVar3 * 2 + (uint)bVar4 + (uint)bVar5 * 2 >> 3);
    *oq2 = (uint8_t)(iVar7 + (uint)bVar3 + (uint)bVar4 * 2 + (uint)bVar5 + (uint)bVar5 * 2 >> 3);
    return;
  }
  filter4(mask,thresh,op1,op0,oq0,oq1);
  return;
}

Assistant:

static inline void filter8(int8_t mask, uint8_t thresh, int8_t flat,
                           uint8_t *op3, uint8_t *op2, uint8_t *op1,
                           uint8_t *op0, uint8_t *oq0, uint8_t *oq1,
                           uint8_t *oq2, uint8_t *oq3) {
  if (flat && mask) {
    const uint8_t p3 = *op3, p2 = *op2, p1 = *op1, p0 = *op0;
    const uint8_t q0 = *oq0, q1 = *oq1, q2 = *oq2, q3 = *oq3;

    // 7-tap filter [1, 1, 1, 2, 1, 1, 1]
    *op2 = ROUND_POWER_OF_TWO(p3 + p3 + p3 + 2 * p2 + p1 + p0 + q0, 3);
    *op1 = ROUND_POWER_OF_TWO(p3 + p3 + p2 + 2 * p1 + p0 + q0 + q1, 3);
    *op0 = ROUND_POWER_OF_TWO(p3 + p2 + p1 + 2 * p0 + q0 + q1 + q2, 3);
    *oq0 = ROUND_POWER_OF_TWO(p2 + p1 + p0 + 2 * q0 + q1 + q2 + q3, 3);
    *oq1 = ROUND_POWER_OF_TWO(p1 + p0 + q0 + 2 * q1 + q2 + q3 + q3, 3);
    *oq2 = ROUND_POWER_OF_TWO(p0 + q0 + q1 + 2 * q2 + q3 + q3 + q3, 3);
  } else {
    filter4(mask, thresh, op1, op0, oq0, oq1);
  }
}